

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  long lVar6;
  float local_3930;
  int local_392c;
  float avgFPS;
  int i_2;
  void *m_pixels;
  int local_3918;
  int pitch;
  int i_1;
  int i;
  SDL_Event event;
  long countedFrames;
  long start_per_frame;
  long start;
  uint local_38b8;
  int timer;
  uint pixels [2048];
  SDL_Texture *texture;
  SDL_Renderer *renderer;
  SDL_Window *window;
  string local_1898;
  undefined1 local_1864 [8];
  CHIP8 emulator;
  char **argv_local;
  int argc_local;
  
  emulator._6212_8_ = argv;
  if (argc < 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"No ROM specified!\nUsage:\t");
    poVar4 = std::operator<<(poVar4,*(char **)emulator._6212_8_);
    poVar4 = std::operator<<(poVar4," <ROM path>");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    return 1;
  }
  CHIP8::CHIP8((CHIP8 *)local_1864);
  CHIP8::initialise((CHIP8 *)local_1864);
  pcVar5 = *(char **)(emulator._6212_8_ + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1898,pcVar5,(allocator<char> *)((long)&window + 7));
  bVar1 = CHIP8::loadROM((CHIP8 *)local_1864,&local_1898);
  std::__cxx11::string::~string((string *)&local_1898);
  std::allocator<char>::~allocator((allocator<char> *)((long)&window + 7));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    exit(1);
  }
  pixels[0x7fe] = 0;
  pixels[0x7ff] = 0;
  iVar2 = SDL_Init(0xf231);
  if (iVar2 < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Couldn\'t initialise SDL!\n");
    pcVar5 = (char *)SDL_GetError();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  lVar6 = SDL_CreateWindow("CHIP8-Emulator",0x1fff0000,0x1fff0000,0x400,0x300,0x20);
  if (lVar6 != 0) {
    lVar6 = SDL_CreateRenderer(lVar6,0xffffffff,0);
    if (lVar6 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Couldn\'t create Renderer!\n");
      pcVar5 = (char *)SDL_GetError();
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    pixels._8184_8_ = SDL_CreateTexture(lVar6,0x16362004,1,0x40,0x20);
    if (pixels._8184_8_ != 0) {
      start._4_4_ = 0;
      uVar3 = SDL_GetTicks();
      start_per_frame = (long)uVar3;
      uVar3 = SDL_GetTicks();
      countedFrames = (long)uVar3;
      event._48_8_ = 0;
      while( true ) {
        while (iVar2 = SDL_PollEvent(), iVar2 == 0) {
          if (start._4_4_ == 0) {
            CHIP8::emulateCycle((CHIP8 *)local_1864);
            start._4_4_ = 0;
          }
          else {
            start._4_4_ = start._4_4_ + 1;
          }
          if ((emulator.key[8] & 1) != 0) {
            iVar2 = SDL_LockTexture(pixels._8184_8_,0,&avgFPS,(long)&m_pixels + 4);
            if (iVar2 < 0) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Couldn\'t lock texture!\n");
              pcVar5 = (char *)SDL_GetError();
              poVar4 = std::operator<<(poVar4,pcVar5);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            for (local_392c = 0; local_392c < 0x800; local_392c = local_392c + 1) {
              (&local_38b8)[local_392c] = (uint)(byte)local_1864[local_392c] * 0xffffff | 0xff000000
              ;
            }
            memcpy(_avgFPS,&local_38b8,(long)(m_pixels._4_4_ << 5));
            SDL_UnlockTexture(pixels._8184_8_);
            SDL_RenderClear(lVar6);
            SDL_RenderCopy(lVar6,pixels._8184_8_,0);
            SDL_RenderPresent(lVar6);
            emulator.key[8] = '\0';
            uVar3 = SDL_GetTicks();
            if ((long)((ulong)uVar3 - countedFrames) < 0x10) {
              iVar2 = SDL_GetTicks();
              SDL_Delay(((int)countedFrames - iVar2) + 0x10);
            }
            uVar3 = SDL_GetTicks();
            countedFrames = (long)uVar3;
            local_3930 = (float)(long)event._48_8_;
            uVar3 = SDL_GetTicks();
            local_3930 = local_3930 / ((float)(long)((ulong)uVar3 - start_per_frame) / 1000.0);
            if (2e+06 < local_3930) {
              local_3930 = 0.0;
            }
            event._48_8_ = event._48_8_ + 1;
            poVar4 = std::operator<<((ostream *)&std::cerr,"Avg. FPS: ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3930);
            std::operator<<(poVar4,"\r");
          }
          if ((emulator.key[9] & 1) != 0) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Beep!!                    \r");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            emulator.key[9] = '\0';
          }
        }
        if (i_1 == 0x100) break;
        if (i_1 == 0x300) {
          if (event.motion.which == 0x1b) {
            exit(0);
          }
          for (pitch = 0; pitch < 0x10; pitch = pitch + 1) {
            if (event.motion.which == SDLKeys[pitch]) {
              emulator.key[(long)pitch + -8] = '\x01';
            }
          }
        }
        if (i_1 == 0x301) {
          for (local_3918 = 0; local_3918 < 0x10; local_3918 = local_3918 + 1) {
            if (event.motion.which == SDLKeys[local_3918]) {
              emulator.key[(long)local_3918 + -8] = '\0';
            }
          }
        }
      }
      exit(0);
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Couldn\'t create texture!\n");
    pcVar5 = (char *)SDL_GetError();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Couldn\'t create Window!\n");
  pcVar5 = (char *)SDL_GetError();
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int main(int argc, char** argv){

    if(argc < 2){
        std::cerr << "No ROM specified!\nUsage:\t" << argv[0] << " <ROM path>" << std::endl;
        return 1;
    }

    CHIP8 emulator;

    emulator.initialise();

    if (!emulator.loadROM(argv[1])){
        exit(1);
    }

    SDL_Window   *window   = NULL;
    SDL_Renderer *renderer = NULL;
    SDL_Texture  *texture  = NULL;

    if (SDL_Init(SDL_INIT_EVERYTHING) < 0){
        std::cerr << "Couldn't initialise SDL!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    window = SDL_CreateWindow("CHIP8-Emulator",
                SDL_WINDOWPOS_UNDEFINED,
                SDL_WINDOWPOS_UNDEFINED,
                WINDOW_WIDTH, WINDOW_HEIGHT,
                SDL_WINDOW_RESIZABLE);

    if (window == NULL){
        std::cerr << "Couldn't create Window!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    renderer = SDL_CreateRenderer(window, -1, 0);

    if (renderer == NULL){
        std::cerr << "Couldn't create Renderer!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    texture = SDL_CreateTexture(renderer,
                    SDL_PIXELFORMAT_ARGB8888,
                    SDL_TEXTUREACCESS_STREAMING,
                    GRAPHICS_WIDTH, GRAPHICS_HEIGHT);

    if(texture == NULL){
        std::cerr << "Couldn't create texture!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    unsigned int pixels[GRAPHICS_HEIGHT * GRAPHICS_WIDTH];
    int  timer = 0;
    long start = SDL_GetTicks(); // For measuring average FPS
    long start_per_frame = SDL_GetTicks(); // For capping FPS
    long countedFrames = 0;

    while(true){

        SDL_Event event;

        while(SDL_PollEvent(&event)) {
            if (event.type == SDL_QUIT)
                exit(0);

            if (event.type == SDL_KEYDOWN){
                if (event.key.keysym.sym == SDLK_ESCAPE)
                    exit(0);

                for (int i = 0; i < TOTAL_KEYS; ++i){
                    if (event.key.keysym.sym == SDLKeys[i]){
                        emulator.key[i] = 1;
                    }
                }
            }

            if (event.type == SDL_KEYUP){
                for (int i = 0; i < TOTAL_KEYS; ++i){
                    if (event.key.keysym.sym == SDLKeys[i]){
                        emulator.key[i] = 0;
                    }
                }
            }
        }

        if (timer == CLOCK_DELAYER){
            emulator.emulateCycle();
            timer = 0;
        }

        else {
            timer += 1;
        }


        int pitch;
        void* m_pixels;


        if (emulator.drawFlag){

            if(SDL_LockTexture(texture, NULL, (void **)&m_pixels, &pitch) < 0){
                std::cerr << "Couldn't lock texture!\n" << SDL_GetError() << std::endl;
            }

            for (int i = 0; i < (GRAPHICS_HEIGHT * GRAPHICS_WIDTH); ++i){
                pixels[i] = ((0x00FFFFFF *  emulator.graphics[i]) | 0xFF000000);
            }

            memcpy(m_pixels, pixels, GRAPHICS_HEIGHT*pitch);
            SDL_UnlockTexture(texture);

            SDL_RenderClear(renderer);
            SDL_RenderCopy(renderer,texture,NULL,NULL);
            SDL_RenderPresent(renderer);


            emulator.drawFlag = false;

            if((1000 / FPS_CAP) > (SDL_GetTicks() - start_per_frame)){
                SDL_Delay( (1000 / FPS_CAP) - (SDL_GetTicks() - start_per_frame));
            }
            start_per_frame = SDL_GetTicks();
            float avgFPS = countedFrames / ( (SDL_GetTicks() - start) / 1000.f );
			if( avgFPS > 2000000 ){
				avgFPS = 0;
			}
            ++countedFrames;

            std::cerr << "Avg. FPS: " << avgFPS << "\r";
        }
        if (emulator.beepFlag){
            std::cerr << "Beep!!                    \r" << std::endl;
            //TODO

            emulator.beepFlag = false;
        }

    }

    return 0;
}